

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O1

bool __thiscall Tree::check(Tree *this,Node *me,Node *you)

{
  bool bVar1;
  bool bVar2;
  
  if (me->data == you->data) {
    if ((me->left == (Node *)0x0) && (you->left == (Node *)0x0)) {
      bVar1 = true;
    }
    else {
      bVar1 = check(this,me->left,you->left);
    }
    if ((me->right != (Node *)0x0) || (you->right != (Node *)0x0)) {
      bVar2 = check(this,me->right,you->right);
      bVar1 = (bool)(bVar1 & bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool check(Node *me, Node *you) {
        if (me->data != you->data) {
            return false;
        } else {
            bool b = true;
            if (me->left != nullptr || you->left != nullptr)
                b = b & check(me->left, you->left);
            if (me->right != nullptr || you->right != nullptr)
                b = b & check(me->right, you->right);
            return b;
        }
    }